

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall crnlib::mipmapped_texture::~mipmapped_texture(mipmapped_texture *this)

{
  mipmapped_texture *this_local;
  
  free_all_mips(this);
  dynamic_string::~dynamic_string(&this->m_last_error);
  vector<crnlib::vector<crnlib::mip_level_*>_>::~vector(&this->m_faces);
  dynamic_string::~dynamic_string(&this->m_name);
  return;
}

Assistant:

mipmapped_texture::~mipmapped_texture() {
  free_all_mips();
}